

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall arangodb::velocypack::Parser::Parser(Parser *this)

{
  element_type *peVar1;
  __shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_start = (uint8_t *)0x0;
  this->_size = 0;
  *(undefined8 *)((long)&this->_size + 4) = 0;
  *(undefined8 *)((long)&this->_pos + 4) = 0;
  this->options = &Options::Defaults;
  std::make_shared<arangodb::velocypack::Builder>();
  std::__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *)this,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  peVar1 = (this->_builder).
           super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->_builderPtr = peVar1;
  peVar1->options = &Options::Defaults;
  return;
}

Assistant:

Parser()
      : _start(nullptr),
        _size(0),
        _pos(0),
        _nesting(0),
        options(&Options::Defaults) {
    _builder = std::make_shared<Builder>();
    _builderPtr = _builder.get();
    _builderPtr->options = &Options::Defaults;
  }